

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  code *pcVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  undefined1 uVar6;
  ImDrawList *this;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  if ((((GImGui->HoveredId == id || GImGui->HoveredId == 0) ||
       (GImGui->HoveredIdAllowOverlap == true)) &&
      (pIVar1 = GImGui->CurrentWindow, GImGui->HoveredWindow == pIVar1)) &&
     ((GImGui->ActiveId == id || GImGui->ActiveId == 0 || (GImGui->ActiveIdAllowOverlap == true))))
  {
    bVar5 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if ((bVar5) && (pIVar4->NavDisableMouseHover == false)) {
      if (((((pIVar4->NavWindow == (ImGuiWindow *)0x0) ||
            (pIVar2 = pIVar4->NavWindow->RootWindow, pIVar2 == (ImGuiWindow *)0x0)) ||
           (pIVar2->WasActive != true)) ||
          ((pIVar2 == pIVar1->RootWindow || ((pIVar2->Flags & 0xc000000) == 0)))) &&
         ((pIVar4->CurrentItemFlags & 4) == 0)) {
        if (id == 0) {
          return true;
        }
        pIVar4->HoveredId = id;
        pIVar4->HoveredIdAllowOverlap = false;
        pIVar4->HoveredIdUsingMouseWheel = false;
        if (pIVar4->HoveredIdPreviousFrame != id) {
          pIVar4->HoveredIdTimer = 0.0;
          pIVar4->HoveredIdNotActiveTimer = 0.0;
        }
        if ((pIVar4->DebugItemPickerActive == true) && (pIVar4->HoveredIdPreviousFrame == id)) {
          this = GetForegroundDrawList();
          ImDrawList::AddRect(this,&bb->Min,&bb->Max,0xff00ffff,0.0,0,1.0);
        }
        if (pIVar4->DebugItemPickerBreakId != id) {
          return true;
        }
        pcVar3 = (code *)swi(3);
        uVar6 = (*pcVar3)();
        return (bool)uVar6;
      }
      pIVar4->HoveredIdDisabled = true;
    }
  }
  return false;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;
    if (g.NavDisableMouseHover)
        return false;
    if (!IsWindowContentHoverable(window, ImGuiHoveredFlags_None) || (g.CurrentItemFlags & ImGuiItemFlags_Disabled))
    {
        g.HoveredIdDisabled = true;
        return false;
    }

    // We exceptionally allow this function to be called with id==0 to allow using it for easy high-level
    // hover test in widgets code. We could also decide to split this function is two.
    if (id != 0)
    {
        SetHoveredID(id);

        // [DEBUG] Item Picker tool!
        // We perform the check here because SetHoveredID() is not frequently called (1~ time a frame), making
        // the cost of this tool near-zero. We can get slightly better call-stack and support picking non-hovered
        // items if we perform the test in ItemAdd(), but that would incur a small runtime cost.
        // #define IMGUI_DEBUG_TOOL_ITEM_PICKER_EX in imconfig.h if you want this check to also be performed in ItemAdd().
        if (g.DebugItemPickerActive && g.HoveredIdPreviousFrame == id)
            GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 255, 0, 255));
        if (g.DebugItemPickerBreakId == id)
            IM_DEBUG_BREAK();
    }

    return true;
}